

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *node;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  Texture2DFilteringCase *this_00;
  TextureCubeFilteringCase *this_01;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  long lVar9;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  TestNode *local_178;
  anon_struct_16_2_3f8b7511 *local_170;
  anon_struct_16_2_3f8b7511 *local_168;
  anon_struct_16_2_3f8b7511 *local_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  string name;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long local_78;
  long local_70;
  long *local_68 [2];
  long local_58 [2];
  TextureFilteringTests *local_48;
  long local_40;
  TestNode *local_38;
  
  local_178 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_178,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_178);
  local_48 = this;
  local_38 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar9 = 0;
  do {
    local_170 = init::minFilterModes + lVar9;
    lVar2 = 0;
    local_40 = lVar9;
    do {
      local_168 = init::magFilterModes + lVar2;
      local_70 = 0;
      local_78 = lVar2;
      do {
        local_160 = init::wrapModes + local_70;
        lVar9 = 0;
        do {
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_68);
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_88 = *plVar5;
            lStack_80 = plVar3[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar5;
            local_98 = (long *)*plVar3;
          }
          local_90 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_158 = &local_148;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_148 = *plVar5;
            lStack_140 = plVar3[3];
          }
          else {
            local_148 = *plVar5;
            local_158 = (long *)*plVar3;
          }
          local_150 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_138 = &local_128;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_128 = *plVar5;
            lStack_120 = plVar3[3];
          }
          else {
            local_128 = *plVar5;
            local_138 = (long *)*plVar3;
          }
          local_130 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
          local_118 = &local_108;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_108 = *plVar5;
            lStack_100 = plVar3[3];
          }
          else {
            local_108 = *plVar5;
            local_118 = (long *)*plVar3;
          }
          local_110 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_f8 = &local_e8;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_e8 = *plVar5;
            lStack_e0 = plVar3[3];
          }
          else {
            local_e8 = *plVar5;
            local_f8 = (long *)*plVar3;
          }
          local_f0 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_d8 = &local_c8;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_c8 = *plVar5;
            lStack_c0 = plVar3[3];
          }
          else {
            local_c8 = *plVar5;
            local_d8 = (long *)*plVar3;
          }
          local_d0 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_1d8 = &local_1c8;
          puVar6 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar6) {
            local_1c8 = *puVar6;
            uStack_1c0 = (undefined4)plVar3[3];
            uStack_1bc = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_1c8 = *puVar6;
            local_1d8 = (ulong *)*plVar3;
          }
          local_1d0 = plVar3[1];
          *plVar3 = (long)puVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_198 = local_188;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_","");
          uVar8 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar8 = local_1c8;
          }
          if (uVar8 < (ulong)(local_190 + local_1d0)) {
            uVar8 = 0xf;
            if (local_198 != local_188) {
              uVar8 = local_188[0];
            }
            if (uVar8 < (ulong)(local_190 + local_1d0)) goto LAB_00444f99;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1d8)
            ;
          }
          else {
LAB_00444f99:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_198);
          }
          local_1b8 = &local_1a8;
          plVar3 = puVar4 + 2;
          if ((long *)*puVar4 == plVar3) {
            local_1a8 = *plVar3;
            uStack_1a0 = puVar4[3];
          }
          else {
            local_1a8 = *plVar3;
            local_1b8 = (long *)*puVar4;
          }
          local_1b0 = puVar4[1];
          *puVar4 = plVar3;
          puVar4[1] = 0;
          *(undefined1 *)plVar3 = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar7 = (size_type *)(plVar3 + 2);
          if ((size_type *)*plVar3 == psVar7) {
            name.field_2._M_allocated_capacity = *psVar7;
            name.field_2._8_8_ = plVar3[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar7;
            name._M_dataplus._M_p = (pointer)*plVar3;
          }
          name._M_string_length = plVar3[1];
          *plVar3 = (long)psVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if (local_198 != local_188) {
            operator_delete(local_198,local_188[0] + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          this_00 = (Texture2DFilteringCase *)operator_new(0x128);
          pCVar1 = (local_48->super_TestCaseGroup).m_context;
          Texture2DFilteringCase::Texture2DFilteringCase
                    (this_00,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                     name._M_dataplus._M_p,"",local_170->mode,local_168->mode,local_160->mode,
                     local_160->mode,0x8058,*(int *)((long)&init::sizes2D[0].width + lVar9),
                     *(int *)((long)&init::sizes2D[0].height + lVar9));
          tcu::TestNode::addChild(local_178,(TestNode *)this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar9 == 0x10);
        local_70 = local_70 + 1;
      } while (local_70 != 3);
      lVar2 = local_78 + 1;
    } while (local_78 == 0);
    lVar9 = local_40 + 1;
  } while (lVar9 != 6);
  local_78 = 0;
  do {
    local_170 = init::minFilterModes + local_78;
    lVar9 = 0;
    do {
      local_168 = init::magFilterModes + lVar9;
      local_178 = (TestNode *)0x0;
      local_70 = lVar9;
      do {
        local_160 = init::wrapModes + (long)local_178;
        lVar9 = 0;
        do {
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_68);
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_88 = *plVar5;
            lStack_80 = plVar3[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar5;
            local_98 = (long *)*plVar3;
          }
          local_90 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_158 = &local_148;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_148 = *plVar5;
            lStack_140 = plVar3[3];
          }
          else {
            local_148 = *plVar5;
            local_158 = (long *)*plVar3;
          }
          local_150 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_138 = &local_128;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_128 = *plVar5;
            lStack_120 = plVar3[3];
          }
          else {
            local_128 = *plVar5;
            local_138 = (long *)*plVar3;
          }
          local_130 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
          local_118 = &local_108;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_108 = *plVar5;
            lStack_100 = plVar3[3];
          }
          else {
            local_108 = *plVar5;
            local_118 = (long *)*plVar3;
          }
          local_110 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_f8 = &local_e8;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_e8 = *plVar5;
            lStack_e0 = plVar3[3];
          }
          else {
            local_e8 = *plVar5;
            local_f8 = (long *)*plVar3;
          }
          local_f0 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_d8 = &local_c8;
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_c8 = *plVar5;
            lStack_c0 = plVar3[3];
          }
          else {
            local_c8 = *plVar5;
            local_d8 = (long *)*plVar3;
          }
          local_d0 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_1d8 = &local_1c8;
          puVar6 = (ulong *)(plVar3 + 2);
          if ((ulong *)*plVar3 == puVar6) {
            local_1c8 = *puVar6;
            uStack_1c0 = (undefined4)plVar3[3];
            uStack_1bc = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_1c8 = *puVar6;
            local_1d8 = (ulong *)*plVar3;
          }
          local_1d0 = plVar3[1];
          *plVar3 = (long)puVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_198 = local_188;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_","");
          uVar8 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar8 = local_1c8;
          }
          if (uVar8 < (ulong)(local_190 + local_1d0)) {
            uVar8 = 0xf;
            if (local_198 != local_188) {
              uVar8 = local_188[0];
            }
            if (uVar8 < (ulong)(local_190 + local_1d0)) goto LAB_00445668;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1d8)
            ;
          }
          else {
LAB_00445668:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_198);
          }
          plVar3 = puVar4 + 2;
          if ((long *)*puVar4 == plVar3) {
            local_1a8 = *plVar3;
            uStack_1a0 = puVar4[3];
            local_1b8 = &local_1a8;
          }
          else {
            local_1a8 = *plVar3;
            local_1b8 = (long *)*puVar4;
          }
          local_1b0 = puVar4[1];
          *puVar4 = plVar3;
          puVar4[1] = 0;
          *(undefined1 *)plVar3 = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar7 = (size_type *)(plVar3 + 2);
          if ((size_type *)*plVar3 == psVar7) {
            name.field_2._M_allocated_capacity = *psVar7;
            name.field_2._8_8_ = plVar3[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar7;
            name._M_dataplus._M_p = (pointer)*plVar3;
          }
          name._M_string_length = plVar3[1];
          *plVar3 = (long)psVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if (local_198 != local_188) {
            operator_delete(local_198,local_188[0] + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
          pCVar1 = (local_48->super_TestCaseGroup).m_context;
          TextureCubeFilteringCase::TextureCubeFilteringCase
                    (this_01,(local_48->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                     name._M_dataplus._M_p,"",local_170->mode,local_168->mode,local_160->mode,
                     local_160->mode,false,0x8058,*(int *)((long)&init::sizesCube[0].width + lVar9),
                     *(int *)((long)&init::sizesCube[0].height + lVar9));
          tcu::TestNode::addChild(local_38,(TestNode *)this_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar9 == 0x10);
        local_178 = (TestNode *)((long)local_178 + 1);
      } while (local_178 != (TestNode *)0x3);
      lVar9 = local_70 + 1;
    } while (local_70 == 0);
    local_78 = local_78 + 1;
    if (local_78 == 6) {
      return 6;
    }
  } while( true );
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} formats[] =
	{
		{ "rgba8",		GL_RGBA8 }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 false,
															 formats[format].format,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}